

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O3

void al_use_transform(ALLEGRO_TRANSFORM *trans)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _Bool _Var8;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *pAVar9;
  
  bitmap = al_get_target_bitmap();
  if (bitmap != (ALLEGRO_BITMAP *)0x0) {
    if (&bitmap->transform != trans) {
      uVar1 = *(undefined8 *)trans->m[0];
      uVar2 = *(undefined8 *)(trans->m[0] + 2);
      uVar3 = *(undefined8 *)trans->m[1];
      uVar4 = *(undefined8 *)(trans->m[1] + 2);
      uVar5 = *(undefined8 *)trans->m[2];
      uVar6 = *(undefined8 *)(trans->m[2] + 2);
      uVar7 = *(undefined8 *)(trans->m[3] + 2);
      *(undefined8 *)(bitmap->transform).m[3] = *(undefined8 *)trans->m[3];
      *(undefined8 *)((bitmap->transform).m[3] + 2) = uVar7;
      *(undefined8 *)(bitmap->transform).m[2] = uVar5;
      *(undefined8 *)((bitmap->transform).m[2] + 2) = uVar6;
      *(undefined8 *)(bitmap->transform).m[1] = uVar3;
      *(undefined8 *)((bitmap->transform).m[1] + 2) = uVar4;
      *(undefined8 *)(bitmap->transform).m[0] = uVar1;
      *(undefined8 *)((bitmap->transform).m[0] + 2) = uVar2;
      bitmap->inverse_transform_dirty = true;
    }
    _Var8 = al_is_bitmap_drawing_held();
    if (!_Var8) {
      pAVar9 = _al_get_bitmap_display(bitmap);
      if (pAVar9 != (ALLEGRO_DISPLAY *)0x0) {
        (*pAVar9->vt->update_transformation)(pAVar9,bitmap);
        return;
      }
    }
  }
  return;
}

Assistant:

void al_use_transform(const ALLEGRO_TRANSFORM *trans)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ALLEGRO_DISPLAY *display;

   if (!target)
      return;

   /* Changes to a back buffer should affect the front buffer, and vice versa.
    * Currently we rely on the fact that in the OpenGL drivers the back buffer
    * and front buffer bitmaps are exactly the same, and the DirectX driver
    * doesn't support front buffer bitmaps.
    */

   if (trans != &target->transform) {
      al_copy_transform(&target->transform, trans);

      target->inverse_transform_dirty = true;
   }

   /*
    * When the drawing is held, we apply the transformations in software,
    * so the hardware transformation has to be kept at identity.
    */
   if (!al_is_bitmap_drawing_held()) {
      display = _al_get_bitmap_display(target);
      if (display) {
         display->vt->update_transformation(display, target);
      }
   }
}